

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextboundaryfinder.cpp
# Opt level: O0

BoundaryReasons __thiscall QTextBoundaryFinder::boundaryReasons(QTextBoundaryFinder *this)

{
  QFlags<QTextBoundaryFinder::BoundaryReason> QVar1;
  BoundaryReasons BVar2;
  qsizetype qVar3;
  char16_t *pcVar4;
  undefined4 *in_RDI;
  long in_FS_OFFSET;
  bool bVar5;
  QCharAttributes attr;
  BoundaryReasons reasons;
  BoundaryReason in_stack_ffffffffffffff7c;
  QFlags<QTextBoundaryFinder::BoundaryReason> *in_stack_ffffffffffffff80;
  enum_type eVar7;
  long lVar6;
  QStringView *in_stack_ffffffffffffff88;
  QChar local_1e;
  QFlagsStorageHelper<QTextBoundaryFinder::BoundaryReason,_4> local_1c;
  QFlagsStorageHelper<QTextBoundaryFinder::BoundaryReason,_4> local_18;
  QFlagsStorageHelper<QTextBoundaryFinder::BoundaryReason,_4> local_14;
  byte local_d;
  QFlagsStorage<QTextBoundaryFinder::BoundaryReason> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c.i = 0xaaaaaaaa;
  QFlags<QTextBoundaryFinder::BoundaryReason>::QFlags
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
  if (((*(long *)(in_RDI + 0x10) != 0) && (-1 < *(long *)(in_RDI + 0xc))) &&
     (lVar6 = *(long *)(in_RDI + 0xc), qVar3 = QStringView::size((QStringView *)(in_RDI + 8)),
     lVar6 <= qVar3)) {
    local_d = *(byte *)(*(long *)(in_RDI + 0x10) + *(long *)(in_RDI + 0xc));
    eVar7 = (enum_type)((ulong)in_stack_ffffffffffffff80 >> 0x20);
    switch(*in_RDI) {
    case 0:
      if ((local_d & 1) != 0) {
        local_14.super_QFlagsStorage<QTextBoundaryFinder::BoundaryReason>.i =
             (QFlagsStorage<QTextBoundaryFinder::BoundaryReason>)
             ::operator|(eVar7,(enum_type)in_stack_ffffffffffffff80);
        QVar1 = QFlags<QTextBoundaryFinder::BoundaryReason>::operator|
                          (in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
        eVar7 = (enum_type)((ulong)in_stack_ffffffffffffff80 >> 0x20);
        QFlags<QTextBoundaryFinder::BoundaryReason>::operator|=
                  ((QFlags<QTextBoundaryFinder::BoundaryReason> *)&local_c,QVar1);
        if (*(long *)(in_RDI + 0xc) == 0) {
          BVar2 = ::operator~(eVar7);
          QFlags<QTextBoundaryFinder::BoundaryReason>::operator&=
                    ((QFlags<QTextBoundaryFinder::BoundaryReason> *)&local_c,
                     (QFlags<QTextBoundaryFinder::BoundaryReason>)
                     BVar2.super_QFlagsStorageHelper<QTextBoundaryFinder::BoundaryReason,_4>.
                     super_QFlagsStorage<QTextBoundaryFinder::BoundaryReason>.i);
        }
        else {
          lVar6 = *(long *)(in_RDI + 0xc);
          qVar3 = QStringView::size((QStringView *)(in_RDI + 8));
          if (lVar6 == qVar3) {
            BVar2 = ::operator~(eVar7);
            QFlags<QTextBoundaryFinder::BoundaryReason>::operator&=
                      ((QFlags<QTextBoundaryFinder::BoundaryReason> *)&local_c,
                       (QFlags<QTextBoundaryFinder::BoundaryReason>)
                       BVar2.super_QFlagsStorageHelper<QTextBoundaryFinder::BoundaryReason,_4>.
                       super_QFlagsStorage<QTextBoundaryFinder::BoundaryReason>.i);
          }
        }
      }
      break;
    case 1:
      if ((local_d >> 1 & 1) != 0) {
        QFlags<QTextBoundaryFinder::BoundaryReason>::operator|=
                  ((QFlags<QTextBoundaryFinder::BoundaryReason> *)&local_c,BreakOpportunity);
        if ((local_d >> 5 & 1) != 0) {
          QFlags<QTextBoundaryFinder::BoundaryReason>::operator|=
                    ((QFlags<QTextBoundaryFinder::BoundaryReason> *)&local_c,StartOfItem);
        }
        if ((local_d >> 6 & 1) != 0) {
          QFlags<QTextBoundaryFinder::BoundaryReason>::operator|=
                    ((QFlags<QTextBoundaryFinder::BoundaryReason> *)&local_c,EndOfItem);
        }
      }
      break;
    case 2:
      if ((local_d >> 2 & 1) != 0) {
        local_18.super_QFlagsStorage<QTextBoundaryFinder::BoundaryReason>.i =
             (QFlagsStorage<QTextBoundaryFinder::BoundaryReason>)
             ::operator|(eVar7,(enum_type)in_stack_ffffffffffffff80);
        QVar1 = QFlags<QTextBoundaryFinder::BoundaryReason>::operator|
                          (in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
        eVar7 = (enum_type)((ulong)in_stack_ffffffffffffff80 >> 0x20);
        QFlags<QTextBoundaryFinder::BoundaryReason>::operator|=
                  ((QFlags<QTextBoundaryFinder::BoundaryReason> *)&local_c,QVar1);
        if (*(long *)(in_RDI + 0xc) == 0) {
          BVar2 = ::operator~(eVar7);
          QFlags<QTextBoundaryFinder::BoundaryReason>::operator&=
                    ((QFlags<QTextBoundaryFinder::BoundaryReason> *)&local_c,
                     (QFlags<QTextBoundaryFinder::BoundaryReason>)
                     BVar2.super_QFlagsStorageHelper<QTextBoundaryFinder::BoundaryReason,_4>.
                     super_QFlagsStorage<QTextBoundaryFinder::BoundaryReason>.i);
        }
        else {
          lVar6 = *(long *)(in_RDI + 0xc);
          qVar3 = QStringView::size((QStringView *)(in_RDI + 8));
          if (lVar6 == qVar3) {
            BVar2 = ::operator~(eVar7);
            QFlags<QTextBoundaryFinder::BoundaryReason>::operator&=
                      ((QFlags<QTextBoundaryFinder::BoundaryReason> *)&local_c,
                       (QFlags<QTextBoundaryFinder::BoundaryReason>)
                       BVar2.super_QFlagsStorageHelper<QTextBoundaryFinder::BoundaryReason,_4>.
                       super_QFlagsStorage<QTextBoundaryFinder::BoundaryReason>.i);
          }
        }
      }
      break;
    case 3:
      if (((local_d >> 3 & 1) != 0) || (*(long *)(in_RDI + 0xc) == 0)) {
        QFlags<QTextBoundaryFinder::BoundaryReason>::operator|=
                  ((QFlags<QTextBoundaryFinder::BoundaryReason> *)&local_c,BreakOpportunity);
        if (((char)local_d < '\0') || (*(long *)(in_RDI + 0xc) == 0)) {
          local_1c.super_QFlagsStorage<QTextBoundaryFinder::BoundaryReason>.i =
               (QFlagsStorage<QTextBoundaryFinder::BoundaryReason>)
               ::operator|((enum_type)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                           (enum_type)in_stack_ffffffffffffff80);
          QVar1 = QFlags<QTextBoundaryFinder::BoundaryReason>::operator|
                            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
          eVar7 = (enum_type)((ulong)in_stack_ffffffffffffff80 >> 0x20);
          QFlags<QTextBoundaryFinder::BoundaryReason>::operator|=
                    ((QFlags<QTextBoundaryFinder::BoundaryReason> *)&local_c,QVar1);
          if (*(long *)(in_RDI + 0xc) == 0) {
            BVar2 = ::operator~(eVar7);
            QFlags<QTextBoundaryFinder::BoundaryReason>::operator&=
                      ((QFlags<QTextBoundaryFinder::BoundaryReason> *)&local_c,
                       (QFlags<QTextBoundaryFinder::BoundaryReason>)
                       BVar2.super_QFlagsStorageHelper<QTextBoundaryFinder::BoundaryReason,_4>.
                       super_QFlagsStorage<QTextBoundaryFinder::BoundaryReason>.i);
          }
          else {
            lVar6 = *(long *)(in_RDI + 0xc);
            qVar3 = QStringView::size((QStringView *)(in_RDI + 8));
            if (lVar6 == qVar3) {
              BVar2 = ::operator~((enum_type)((ulong)lVar6 >> 0x20));
              QFlags<QTextBoundaryFinder::BoundaryReason>::operator&=
                        ((QFlags<QTextBoundaryFinder::BoundaryReason> *)&local_c,
                         (QFlags<QTextBoundaryFinder::BoundaryReason>)
                         BVar2.super_QFlagsStorageHelper<QTextBoundaryFinder::BoundaryReason,_4>.
                         super_QFlagsStorage<QTextBoundaryFinder::BoundaryReason>.i);
            }
          }
        }
        else {
          bVar5 = false;
          if (0 < *(long *)(in_RDI + 0xc)) {
            local_1e = QStringView::operator[]
                                 (in_stack_ffffffffffffff88,(qsizetype)in_stack_ffffffffffffff80);
            pcVar4 = QChar::unicode(&local_1e);
            bVar5 = *pcVar4 == L'­';
          }
          if (bVar5) {
            QFlags<QTextBoundaryFinder::BoundaryReason>::operator|=
                      ((QFlags<QTextBoundaryFinder::BoundaryReason> *)&local_c,SoftHyphen);
          }
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QFlagsStorageHelper<QTextBoundaryFinder::BoundaryReason,_4>)
         (QFlagsStorageHelper<QTextBoundaryFinder::BoundaryReason,_4>)local_c.i;
}

Assistant:

QTextBoundaryFinder::BoundaryReasons QTextBoundaryFinder::boundaryReasons() const
{
    BoundaryReasons reasons = NotAtBoundary;
    if (!attributes || pos < 0 || pos > sv.size())
        return reasons;

    const QCharAttributes attr = attributes[pos];
    switch (t) {
    case Grapheme:
        if (attr.graphemeBoundary) {
            reasons |= BreakOpportunity | StartOfItem | EndOfItem;
            if (pos == 0)
                reasons &= (~EndOfItem);
            else if (pos == sv.size())
                reasons &= (~StartOfItem);
        }
        break;
    case Word:
        if (attr.wordBreak) {
            reasons |= BreakOpportunity;
            if (attr.wordStart)
                reasons |= StartOfItem;
            if (attr.wordEnd)
                reasons |= EndOfItem;
        }
        break;
    case Sentence:
        if (attr.sentenceBoundary) {
            reasons |= BreakOpportunity | StartOfItem | EndOfItem;
            if (pos == 0)
                reasons &= (~EndOfItem);
            else if (pos == sv.size())
                reasons &= (~StartOfItem);
        }
        break;
    case Line:
        // ### TR#14 LB2 prohibits break at sot
        if (attr.lineBreak || pos == 0) {
            reasons |= BreakOpportunity;
            if (attr.mandatoryBreak || pos == 0) {
                reasons |= MandatoryBreak | StartOfItem | EndOfItem;
                if (pos == 0)
                    reasons &= (~EndOfItem);
                else if (pos == sv.size())
                    reasons &= (~StartOfItem);
            } else if (pos > 0 && sv[pos - 1].unicode() == QChar::SoftHyphen) {
                reasons |= SoftHyphen;
            }
        }
        break;
    default:
        break;
    }

    return reasons;
}